

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O0

void __thiscall
sqlcheck::TestSuite_MetadataRegexTests_Test::~TestSuite_MetadataRegexTests_Test
          (TestSuite_MetadataRegexTests_Test *this)

{
  TestSuite_MetadataRegexTests_Test *this_local;
  
  ~TestSuite_MetadataRegexTests_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(TestSuite, MetadataRegexTests) {

  std::string regex = "[A-za-z\\-_@]+[0-9]+ ";

  // metadata tribbles
  PrintMatches("bugs_2004", regex);
  PrintMatches("bugs8_foo", regex);

  // metadata tribbles
  PrintMatches("bugs_2004", regex);
  PrintMatches("CREATE TABLE Bugs_2008 ( . . . )", regex);
  PrintMatches("CREATE TABLE Bugs_200843214 ( . . . )", regex);
  PrintMatches("CREATE TABLE tag8 ( . . . )", regex);

}